

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_util.h
# Opt level: O0

bool cali::util::is_one_of(char c,char *characters)

{
  char *local_20;
  char *ptr;
  char *characters_local;
  char c_local;
  
  local_20 = characters;
  while( true ) {
    if (*local_20 == '\0') {
      return false;
    }
    if (*local_20 == c) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

inline bool is_one_of(char c, const char* characters)
{
    for (const char* ptr = characters; *ptr != '\0'; ++ptr)
        if (*ptr == c)
            return true;

    return false;
}